

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall
ON__CChangeTextureCoordinateHelper::DupVertex(ON__CChangeTextureCoordinateHelper *this,int vi)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  ON_Mesh *pOVar4;
  ON_3fPoint *pOVar5;
  ON_3dPoint *pOVar6;
  ON_2fPoint *pOVar7;
  ON_3fVector *pOVar8;
  ON_Color *pOVar9;
  ON_2dPoint *pOVar10;
  ON_SurfaceCurvature *pOVar11;
  bool *pbVar12;
  ON_TextureCoordinates *pOVar13;
  double dVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  long lVar19;
  ON_3fPoint *pOVar20;
  ON_3dPoint *pOVar21;
  ON_2fPoint *pOVar22;
  ON_3fVector *pOVar23;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar24;
  long lVar25;
  int iVar26;
  ON_2dPoint *pOVar27;
  ON_SurfaceCurvature *pOVar28;
  bool *pbVar29;
  int iVar30;
  long lVar31;
  
  if (this->m_vuse_count == 0) {
    uVar17 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    this->m_vuse_count = uVar17;
    uVar16 = (this->m_vuse).m_capacity;
    if (uVar16 < uVar17) {
      ON_SimpleArray<unsigned_int>::SetCapacity(&this->m_vuse,(long)(int)uVar17);
      uVar17 = this->m_vuse_count;
      uVar16 = (this->m_vuse).m_capacity;
    }
    if ((int)uVar17 <= (int)uVar16 && -1 < (int)uVar17) {
      (this->m_vuse).m_count = uVar17;
    }
    puVar3 = (this->m_vuse).m_a;
    if (0 < (int)uVar16 && puVar3 != (uint *)0x0) {
      memset(puVar3,0,(ulong)uVar16 << 2);
    }
    pOVar4 = this->m_mesh;
    if (0 < (pOVar4->m_F).m_count) {
      puVar3 = (this->m_vuse).m_a;
      piVar18 = ((pOVar4->m_F).m_a)->vi + 3;
      lVar25 = 0;
      do {
        uVar17 = ((ON_MeshFace *)(piVar18 + -3))->vi[0];
        iVar26 = this->m_vuse_count;
        if ((int)uVar17 < iVar26 && -1 < (int)uVar17) {
          puVar3[uVar17] = puVar3[uVar17] + 1;
          iVar26 = this->m_vuse_count;
        }
        uVar17 = piVar18[-2];
        if ((int)uVar17 < iVar26 && -1 < (int)uVar17) {
          puVar3[uVar17] = puVar3[uVar17] + 1;
          iVar26 = this->m_vuse_count;
        }
        iVar30 = piVar18[-1];
        if ((-1 < (long)iVar30) && (iVar30 < iVar26)) {
          puVar3[iVar30] = puVar3[iVar30] + 1;
          iVar30 = piVar18[-1];
          iVar26 = this->m_vuse_count;
        }
        iVar2 = *piVar18;
        if (((-1 < (long)iVar2) && (iVar30 != iVar2)) && (iVar2 < iVar26)) {
          puVar3[iVar2] = puVar3[iVar2] + 1;
        }
        lVar25 = lVar25 + 1;
        piVar18 = piVar18 + 4;
      } while (lVar25 < (pOVar4->m_F).m_count);
    }
  }
  if ((-1 < vi) && (vi < this->m_vuse_count)) {
    puVar3 = (this->m_vuse).m_a;
    uVar17 = puVar3[(uint)vi];
    if (uVar17 < 2) {
      return vi;
    }
    puVar3[(uint)vi] = uVar17 - 1;
  }
  ON_SimpleArray<ON_3fPoint>::AppendNew(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  pOVar5 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  lVar25 = (long)(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pOVar20 = (ON_3fPoint *)0x0;
  if (0 < lVar25) {
    pOVar20 = pOVar5 + lVar25 + -1;
  }
  pOVar20->z = pOVar5[vi].z;
  fVar15 = pOVar5[vi].y;
  pOVar20->x = pOVar5[vi].x;
  pOVar20->y = fVar15;
  if (&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint> != (ON_SimpleArray<ON_3dPoint> *)0x0) {
    ON_SimpleArray<ON_3dPoint>::AppendNew(&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>);
    pOVar6 = (this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>).m_a;
    lVar25 = (long)(this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>).m_count;
    pOVar21 = (ON_3dPoint *)0x0;
    if (0 < lVar25) {
      pOVar21 = pOVar6 + lVar25 + -1;
    }
    dVar14 = pOVar6[vi].y;
    pOVar21->x = pOVar6[vi].x;
    pOVar21->y = dVar14;
    pOVar21->z = pOVar6[vi].z;
  }
  if (this->m_bHasVertexTextures == true) {
    ON_SimpleArray<ON_2fPoint>::AppendNew(&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
    pOVar7 = (this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    lVar25 = (long)(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
    pOVar22 = (ON_2fPoint *)0x0;
    if (0 < lVar25) {
      pOVar22 = pOVar7 + lVar25 + -1;
    }
    *pOVar22 = pOVar7[vi];
  }
  if (this->m_bHasVertexNormals == true) {
    ON_SimpleArray<ON_3fVector>::AppendNew(&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
    pOVar8 = (this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
    lVar25 = (long)(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
    pOVar23 = (ON_3fVector *)0x0;
    if (0 < lVar25) {
      pOVar23 = pOVar8 + lVar25 + -1;
    }
    fVar15 = pOVar8[vi].y;
    pOVar23->x = pOVar8[vi].x;
    pOVar23->y = fVar15;
    pOVar23->z = pOVar8[vi].z;
  }
  if (this->m_bHasVertexColors == true) {
    ON_SimpleArray<ON_Color>::AppendNew(&this->m_mesh->m_C);
    pOVar9 = (this->m_mesh->m_C).m_a;
    lVar25 = (long)(this->m_mesh->m_C).m_count;
    paVar24 = (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0;
    if (0 < lVar25) {
      paVar24 = &pOVar9[lVar25 + -1].field_0;
    }
    *paVar24 = pOVar9[vi].field_0;
  }
  if (this->m_bHasSurfaceParameters == true) {
    ON_SimpleArray<ON_2dPoint>::AppendNew(&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
    pOVar10 = (this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
    lVar25 = (long)(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
    pOVar27 = (ON_2dPoint *)0x0;
    if (0 < lVar25) {
      pOVar27 = pOVar10 + lVar25 + -1;
    }
    pOVar10 = pOVar10 + vi;
    dVar14 = pOVar10->y;
    pOVar27->x = pOVar10->x;
    pOVar27->y = dVar14;
  }
  if (this->m_bHasPrincipalCurvatures == true) {
    ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(&this->m_mesh->m_K);
    pOVar11 = (this->m_mesh->m_K).m_a;
    lVar25 = (long)(this->m_mesh->m_K).m_count;
    pOVar28 = (ON_SurfaceCurvature *)0x0;
    if (0 < lVar25) {
      pOVar28 = pOVar11 + lVar25 + -1;
    }
    pOVar11 = pOVar11 + vi;
    dVar14 = pOVar11->k2;
    pOVar28->k1 = pOVar11->k1;
    pOVar28->k2 = dVar14;
  }
  if (this->m_bHasHiddenVertices == true) {
    ON_SimpleArray<bool>::AppendNew(&this->m_mesh->m_H);
    pOVar4 = this->m_mesh;
    pbVar12 = (pOVar4->m_H).m_a;
    bVar1 = pbVar12[vi];
    lVar25 = (long)(pOVar4->m_H).m_count;
    pbVar29 = (bool *)0x0;
    if (0 < lVar25) {
      pbVar29 = pbVar12 + lVar25 + -1;
    }
    *pbVar29 = bVar1;
    if (bVar1 == true) {
      pOVar4->m_hidden_count = pOVar4->m_hidden_count + 1;
    }
  }
  if ((this->m_bHasCachedTextures == true) && (lVar25 = (long)(this->m_TC).m_count, 0 < lVar25)) {
    lVar31 = 0;
    do {
      pOVar13 = (this->m_TC).m_a[lVar31];
      ON_SimpleArray<ON_3fPoint>::AppendNew(&pOVar13->m_T);
      pOVar5 = (pOVar13->m_T).m_a;
      lVar19 = (long)(pOVar13->m_T).m_count;
      pOVar20 = pOVar5 + lVar19 + -1;
      if (lVar19 < 1) {
        pOVar20 = (ON_3fPoint *)0x0;
      }
      pOVar20->z = pOVar5[vi].z;
      fVar15 = pOVar5[vi].y;
      pOVar20->x = pOVar5[vi].x;
      pOVar20->y = fVar15;
      lVar31 = lVar31 + 1;
    } while (lVar25 != lVar31);
  }
  return (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count + -1;
}

Assistant:

int ON__CChangeTextureCoordinateHelper::DupVertex(int vi)
{
  if ( 0 == m_vuse_count )
  {
    // m_vuse[] is an array of length = original number of
    // vertices in m_mesh and m_vuse[vi] = number of faces
    // that reference vertex vi. If this vertex needs to be
    // split, vuse[vi] is decremented.  The ultimate goal
    // is to split a few times as needed so we don't
    // bloat the mesh with repeated calls to changing
    // texture maps. m_vuse[] is set the first time
    // DupVertex() is called.
    m_vuse_count = m_mesh.m_V.Count();
    m_vuse.Reserve(m_vuse_count);
    m_vuse.SetCount(m_vuse_count);
    m_vuse.Zero();
    for ( int fi = 0; fi < m_mesh.m_F.Count(); fi++ )
    {
      const int* Fvi = m_mesh.m_F[fi].vi;
      int i = Fvi[0];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[1];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[2];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[3];
      if ( Fvi[2] != i && i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
    }
  }

  if ( vi >= 0 && vi < m_vuse_count )
  {
    if ( m_vuse[vi] <= 1 )
      return vi; // only one face uses this vertex - no need to dup the vertex

    // otherwise we will duplicate this vertex, reducing its use count by 1.
    m_vuse[vi]--;
  }


  m_mesh.m_V.AppendNew();
  *m_mesh.m_V.Last() = m_mesh.m_V[vi];
  if ( 0 != m_mesh_dV )
  {
    m_mesh_dV->AppendNew();
    *(m_mesh_dV->Last()) = m_mesh_dV->operator[](vi);
  }
  if ( m_bHasVertexTextures )
  {
    m_mesh.m_T.AppendNew();
    *m_mesh.m_T.Last() = m_mesh.m_T[vi];
  }
  if ( m_bHasVertexNormals )
  {
    m_mesh.m_N.AppendNew();
    *m_mesh.m_N.Last() = m_mesh.m_N[vi];
  }
  if ( m_bHasVertexColors )
  {
    m_mesh.m_C.AppendNew();
    *m_mesh.m_C.Last() = m_mesh.m_C[vi];
  }
  if ( m_bHasSurfaceParameters )
  {
    m_mesh.m_S.AppendNew();
    *m_mesh.m_S.Last() = m_mesh.m_S[vi];
  }
  if ( m_bHasPrincipalCurvatures )
  {
    m_mesh.m_K.AppendNew();
    *m_mesh.m_K.Last() = m_mesh.m_K[vi];
  }
  if ( m_bHasHiddenVertices )
  {
    m_mesh.m_H.AppendNew();
    if ( 0 != (*m_mesh.m_H.Last() = m_mesh.m_H[vi]) )
      m_mesh.m_hidden_count++;
  }

  if ( m_bHasCachedTextures )
  {
    // Note:  This m_TC[] is the subset of m_mesh.m_TC[]
    //        that need to be duped.  The constructor
    //        insures that m_TC[i] is not nullptr and
    //        has the right count and capacity.
    //
    //        DO NOT REFERENCE m_mesh.m_TC[] in this block.
    int tccount = m_TC.Count();
    for ( int i = 0; i < tccount; i++ )
    {
      ON_SimpleArray<ON_3fPoint>& T = m_TC[i]->m_T;
      T.AppendNew();
      *T.Last() = T[vi];
    }
  }

  return m_mesh.m_V.Count()-1;
}